

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luajit.c
# Opt level: O2

void dotty(lua_State *L)

{
  long lVar1;
  char *pcVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  char *pcVar6;
  char *pcVar7;
  size_t lmsg;
  
  pcVar2 = progname;
  progname = (char *)0x0;
  while( true ) {
    lua_settop(L,0);
    iVar3 = pushline(L,1);
    if (iVar3 == 0) break;
    while( true ) {
      uVar4 = lua_tolstring(L,1,0);
      uVar5 = lua_objlen(L,1);
      iVar3 = luaL_loadbuffer(L,uVar4,uVar5,"=stdin");
      if (iVar3 != 3) break;
      pcVar6 = (char *)lua_tolstring(L,0xffffffff,&lmsg);
      lVar1 = lmsg - 7;
      pcVar7 = strstr(pcVar6,"\'<eof>\'");
      if (pcVar7 != pcVar6 + lVar1) {
        lua_remove(L,1);
        iVar3 = 3;
        goto LAB_00102e58;
      }
      lua_settop();
      iVar3 = pushline(L,0);
      if (iVar3 == 0) goto LAB_00102ef1;
      lua_pushlstring(L,"\n",1);
      lua_insert(L,0xfffffffe);
      lua_concat(L,3);
    }
    lua_remove(L);
    if (iVar3 == 0) {
      iVar3 = docall(L,0,0);
    }
    else if (iVar3 == -1) break;
LAB_00102e58:
    report(L,iVar3);
    if ((iVar3 == 0) && (iVar3 = lua_gettop(L), 0 < iVar3)) {
      lua_getfield(L,0xffffd8ee,"print");
      lua_insert(L,1);
      iVar3 = lua_gettop(L);
      iVar3 = lua_pcall(L,iVar3 + -1,0,0);
      pcVar6 = progname;
      if (iVar3 != 0) {
        uVar4 = lua_tolstring(L,0xffffffff,0);
        pcVar7 = (char *)lua_pushfstring(L,"error calling \'print\' (%s)",uVar4);
        l_message(pcVar6,pcVar7);
      }
    }
  }
LAB_00102ef1:
  lua_settop(L,0);
  fputs("\n",_stdout);
  fflush(_stdout);
  progname = pcVar2;
  return;
}

Assistant:

static void dotty(lua_State *L)
{
  int status;
  const char *oldprogname = progname;
  progname = NULL;
  while ((status = loadline(L)) != -1) {
    if (status == LUA_OK) status = docall(L, 0, 0);
    report(L, status);
    if (status == LUA_OK && lua_gettop(L) > 0) {  /* any result to print? */
      lua_getglobal(L, "print");
      lua_insert(L, 1);
      if (lua_pcall(L, lua_gettop(L)-1, 0, 0) != 0)
	l_message(progname,
	  lua_pushfstring(L, "error calling " LUA_QL("print") " (%s)",
			      lua_tostring(L, -1)));
    }
  }
  lua_settop(L, 0);  /* clear stack */
  fputs("\n", stdout);
  fflush(stdout);
  progname = oldprogname;
}